

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall
wabt::Stream::Write<unsigned_char>(Stream *this,uchar *data,char *desc,PrintChars print_chars)

{
  PrintChars print_chars_local;
  char *desc_local;
  uchar *data_local;
  Stream *this_local;
  
  WriteData(this,data,1,desc,print_chars);
  return;
}

Assistant:

void Write(const T& data, const char* desc, PrintChars print_chars) {
#if WABT_BIG_ENDIAN
    char tmp[sizeof(T)];
    memcpy(tmp, &data, sizeof(tmp));
    SwapBytesSized(tmp, sizeof(tmp));
    WriteData(tmp, sizeof(tmp), desc, print_chars);
#else
    WriteData(&data, sizeof(data), desc, print_chars);
#endif
  }